

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.h
# Opt level: O2

TcParseTableBase * __thiscall google::protobuf::MessageLite::GetTcParseTable(MessageLite *this)

{
  int iVar1;
  undefined4 extraout_var;
  ClassDataFull *pCVar2;
  TcParseTableBase *pTVar3;
  char *failure_msg;
  LogMessageFatal LStack_18;
  ClassData *this_00;
  
  iVar1 = (*this->_vptr_MessageLite[4])();
  this_00 = (ClassData *)CONCAT44(extraout_var,iVar1);
  if (this_00 == (ClassData *)0x0) {
    failure_msg = "data != nullptr";
    iVar1 = 0x3a2;
  }
  else {
    if (this_00->tc_table != (TcParseTableBase *)0x0) {
      return this_00->tc_table;
    }
    if (this_00->is_lite != true) {
      pCVar2 = internal::ClassData::full(this_00);
      pTVar3 = (*pCVar2->descriptor_methods->get_tc_table)(this);
      return pTVar3;
    }
    failure_msg = "!data->is_lite";
    iVar1 = 0x3a6;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&LStack_18,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/message_lite.h"
             ,iVar1,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&LStack_18);
}

Assistant:

const internal::TcParseTableBase* GetTcParseTable() const {
    auto* data = GetClassData();
    ABSL_DCHECK(data != nullptr);

    auto* tc_table = data->tc_table;
    if (ABSL_PREDICT_FALSE(tc_table == nullptr)) {
      ABSL_DCHECK(!data->is_lite);
      return data->full().descriptor_methods->get_tc_table(*this);
    }
    return tc_table;
  }